

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ParamAssignmentSyntax::isKind(SyntaxKind kind)

{
  return kind == OrderedParamAssignment || kind == NamedParamAssignment;
}

Assistant:

bool ParamAssignmentSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::NamedParamAssignment:
        case SyntaxKind::OrderedParamAssignment:
            return true;
        default:
            return false;
    }
}